

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O2

shared_ptr<KmerList> __thiscall
BatchKmersCounter::kmerCountOMPDiskBased
          (BatchKmersCounter *this,uint8_t K,LongReadsDatastore *reads,uint minCount,string *tmpdir,
          string *workdir,uchar disk_batches)

{
  undefined8 uVar1;
  undefined1 __filename [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  string *psVar3;
  element_type *peVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  ostream *poVar8;
  KMerNodeFreq_s *pKVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  string *psVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  int iVar16;
  ulong uVar17;
  string *psVar18;
  string *psVar19;
  int i_1;
  long lVar20;
  ulong uVar21;
  string *psVar22;
  shared_ptr<KmerList> sVar23;
  ulong uStack_b00;
  undefined1 local_af8 [8];
  uint64_t hist [256];
  undefined1 local_2f0 [8];
  ofstream kff;
  string local_f0;
  string *local_d0;
  string *local_c8;
  long *local_c0;
  shared_ptr<KmerList> kmer_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string *local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  LongReadsDatastore *local_68;
  element_type *local_60;
  shared_ptr<KmerList> *kmerlist;
  string *local_50;
  string *local_48;
  string *local_40;
  ulong local_38;
  
  uStack_b00 = 0x20ef66;
  kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)workdir;
  local_88 = tmpdir;
  local_68 = reads;
  local_60 = (element_type *)this;
  kmerlist._4_4_ = minCount;
  poVar8 = sdglib::OutputLog(INFO,true);
  uStack_b00 = 0x20ef75;
  poVar8 = std::operator<<(poVar8,"disk-based kmer counting with ");
  uStack_b00 = 0x20ef83;
  local_38 = (ulong)disk_batches;
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)disk_batches);
  uStack_b00 = 0x20ef92;
  poVar8 = std::operator<<(poVar8," batches");
  uStack_b00 = 0x20ef9a;
  std::endl<char,std::char_traits<char>>(poVar8);
  uVar21 = local_38;
  local_48 = (string *)CONCAT44(local_48._4_4_,(uint)K);
  psVar18 = (string *)0;
  while ((string *)uVar21 != psVar18) {
    local_40 = (string *)((long)psVar18 + 1);
    lVar11 = ((long)(local_68->read_to_fileRecord).
                    super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(local_68->read_to_fileRecord).
                    super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4) + -1;
    uStack_b00 = 0x20f003;
    kmerCountOMP((BatchKmersCounter *)&local_c0,(uint8_t)local_48,local_68,
                 (ulong)(lVar11 * (long)psVar18) / uVar21,(ulong)(lVar11 * (long)local_40) / uVar21,
                 0);
    uStack_b00 = 0x20f01a;
    std::operator+(&local_a8,local_88,"/kmer_count_batch_");
    uStack_b00 = 0x20f028;
    std::__cxx11::to_string(&local_f0,(int)psVar18);
    uStack_b00 = 0x20f041;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                   &local_a8,&local_f0);
    uStack_b00 = 0x20f056;
    std::ofstream::ofstream(local_af8,(string *)local_2f0,_S_trunc|_S_out|_S_bin);
    uStack_b00 = 0x20f05e;
    std::__cxx11::string::~string((string *)local_2f0);
    uStack_b00 = 0x20f066;
    std::__cxx11::string::~string((string *)&local_f0);
    uStack_b00 = 0x20f072;
    std::__cxx11::string::~string((string *)&local_a8);
    uStack_b00 = 0x20f089;
    std::ostream::write(local_af8,*local_c0);
    uStack_b00 = 0x20f095;
    std::ofstream::close();
    uStack_b00 = 0x20f09f;
    poVar8 = sdglib::OutputLog(INFO,true);
    uStack_b00 = 0x20f0ae;
    poVar8 = std::operator<<(poVar8,"batch ");
    uStack_b00 = 0x20f0b9;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)psVar18);
    uStack_b00 = 0x20f0c8;
    poVar8 = std::operator<<(poVar8," done and dumped with ");
    uStack_b00 = 0x20f0db;
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    uStack_b00 = 0x20f0ea;
    poVar8 = std::operator<<(poVar8," kmers");
    uStack_b00 = 0x20f0f2;
    std::endl<char,std::char_traits<char>>(poVar8);
    uStack_b00 = 0x20f0fe;
    std::ofstream::~ofstream(local_af8);
    uStack_b00 = 0x20f10a;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&kmer_list);
    psVar18 = local_40;
  }
  uStack_b00 = 0x20f11d;
  poVar8 = sdglib::OutputLog(INFO,true);
  uStack_b00 = 0x20f12c;
  poVar8 = std::operator<<(poVar8,"merging from disk");
  uStack_b00 = 0x20f134;
  std::endl<char,std::char_traits<char>>(poVar8);
  iVar16 = (int)uVar21;
  lVar11 = -(ulong)(iVar16 * 0x208 + 0xfU & 0xfffffff0);
  psVar18 = (string *)((long)hist + lVar11 + -8);
  local_50 = psVar18;
  if (uVar21 != 0) {
    lVar20 = 0;
    do {
      psVar19 = local_50 + lVar20;
      *(undefined8 *)((long)&uStack_b00 + lVar11) = 0x20f169;
      std::ifstream::ifstream(psVar19);
      lVar20 = lVar20 + 0x208;
    } while (uVar21 * 0x208 - lVar20 != 0);
  }
  uVar7 = iVar16 + 0xfU & 0xfffffff0;
  psVar19 = psVar18 + (-(ulong)(iVar16 * 0x11 + 0xfU & 0xfffffff0) - (ulong)uVar7);
  local_40 = local_50;
  local_48 = psVar19;
  for (uVar21 = 0; psVar3 = local_88, local_38 != uVar21; uVar21 = uVar21 + 1) {
    *(undefined8 *)(psVar19 + -8) = 0x20f1c6;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                   psVar3,"/kmer_count_batch_");
    *(undefined8 *)(psVar19 + -8) = 0x20f1d8;
    std::__cxx11::to_string(&local_a8,(int)uVar21);
    *(undefined8 *)(psVar19 + -8) = 0x20f1f1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_af8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                   &local_a8);
    psVar22 = local_40;
    *(undefined8 *)(psVar19 + -8) = 0xc;
    *(undefined8 *)(psVar19 + -8) = 0x20f203;
    std::ifstream::open(psVar22,(_Ios_Openmode)
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_af8);
    *(undefined8 *)(psVar19 + -8) = 0x20f20b;
    std::__cxx11::string::~string((string *)local_af8);
    *(undefined8 *)(psVar19 + -8) = 0x20f217;
    std::__cxx11::string::~string((string *)&local_a8);
    *(undefined8 *)(psVar19 + -8) = 0x20f223;
    std::__cxx11::string::~string((string *)local_2f0);
    psVar14 = local_48;
    *(undefined8 *)(psVar19 + -8) = 0x11;
    *(undefined8 *)(psVar19 + -8) = 0x20f235;
    std::istream::read((char *)psVar22,(long)psVar14);
    psVar18[uVar21 - uVar7] = (string)0x1;
    local_48 = psVar14 + 0x11;
    local_40 = psVar22 + 0x208;
  }
  uVar10 = 0;
  *(undefined8 *)(psVar19 + -8) = 1;
  uVar21 = *(ulong *)(psVar19 + -8);
  psVar14 = psVar19;
  while( true ) {
    if (local_38 <= uVar21) break;
    uVar5 = uVar10;
    if ((psVar18[uVar21 - uVar7] == (string)0x1) &&
       (lVar11 = (ulong)uVar10 * 0x11, uVar5 = (uint)uVar21,
       *(ulong *)(psVar19 + lVar11 + 8) <= *(ulong *)(psVar14 + 0x19) &&
       (ulong)(*(ulong *)(psVar14 + 0x11) < *(ulong *)(psVar19 + lVar11)) <=
       *(ulong *)(psVar14 + 0x19) - *(ulong *)(psVar19 + lVar11 + 8))) {
      uVar5 = uVar10;
    }
    uVar10 = uVar5;
    uVar21 = uVar21 + 1;
    psVar14 = psVar14 + 0x11;
  }
  lVar11 = (ulong)uVar10 * 0x11;
  local_68 = (LongReadsDatastore *)*(ulong *)(psVar19 + lVar11);
  local_70 = *(ulong *)(psVar19 + lVar11 + 8);
  for (lVar11 = 0; lVar11 != 0x800; lVar11 = lVar11 + 8) {
    *(undefined8 *)((long)hist + lVar11 + -8) = 0;
  }
  *(undefined8 *)(psVar19 + -8) = 0x20f2cb;
  std::make_shared<KmerList>();
  local_d0 = psVar19 + 0x11;
  local_80 = 0;
  uVar21 = 0;
  psVar14 = (string *)0x0;
  local_78 = 0;
  while( true ) {
    pKVar9 = (KMerNodeFreq_s *)(uVar21 & 0xff);
    uVar10 = (uint)pKVar9;
    if ((uint)local_38 <= (uint)local_80) break;
    local_40 = psVar14;
    *(undefined8 *)(psVar19 + -8) = 0xffffffffffffffff;
    psVar14 = local_d0;
    uVar12 = *(ulong *)(psVar19 + -8);
    do {
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (psVar18[uVar12 - uVar7] != (string)0x1);
    *(undefined8 *)(psVar19 + -8) = 1;
    for (uVar17 = *(ulong *)(psVar19 + -8); local_38 != uVar17; uVar17 = uVar17 + 1) {
      uVar13 = uVar12;
      if ((psVar18[uVar17 - uVar7] == (string)0x1) &&
         (uVar13 = uVar17 & 0xffffffff,
         *(ulong *)(psVar19 + uVar12 * 0x11 + 8) <= *(ulong *)(psVar14 + 8) &&
         (ulong)(*(ulong *)psVar14 < *(ulong *)(psVar19 + uVar12 * 0x11)) <=
         *(ulong *)(psVar14 + 8) - *(ulong *)(psVar19 + uVar12 * 0x11 + 8))) {
        uVar13 = uVar12;
      }
      psVar14 = psVar14 + 0x11;
      uVar12 = uVar13;
    }
    lVar11 = uVar12 * 0x11;
    psVar14 = psVar19 + lVar11;
    uVar17 = *(ulong *)(psVar19 + lVar11);
    uVar13 = *(ulong *)(psVar19 + lVar11 + 8);
    if (local_70 < uVar13 || local_70 - uVar13 < (ulong)(local_68 < uVar17)) {
      hist[(long)&pKVar9[-1].count] = hist[(long)&pKVar9[-1].count] + 1;
      peVar4 = local_60;
      if (uVar10 < kmerlist._4_4_) {
        local_78 = local_78 + 1;
      }
      else {
        pKVar9 = local_60->kmers;
        psVar22 = *(string **)((long)&pKVar9->kdata + 8);
        if (psVar22 <= local_40) {
          local_48 = (string *)CONCAT44(local_48._4_4_,(int)uVar21);
          local_c8 = psVar14;
          *(undefined8 *)(psVar19 + -8) = 0x20f3c0;
          KmerList::resize((KmerList *)pKVar9,(size_t)(psVar22 + 10000000));
          uVar21 = (ulong)local_48 & 0xffffffff;
          pKVar9 = peVar4->kmers;
          psVar14 = local_c8;
        }
        pKVar9 = *(KMerNodeFreq_s **)&pKVar9->kdata;
        *(ulong *)((long)&pKVar9[(long)local_40].kdata + 8) = local_70;
        *(LongReadsDatastore **)&pKVar9[(long)local_40].kdata = local_68;
        pKVar9[(long)local_40].count = (uint8_t)uVar21;
        local_40 = local_40 + 1;
        uVar17 = *(ulong *)psVar14;
        uVar13 = *(ulong *)(psVar14 + 8);
      }
      local_48 = (string *)
                 CONCAT44(local_48._4_4_,(int)CONCAT71((int7)((ulong)pKVar9 >> 8),psVar14[0x10]));
      local_70 = uVar13;
      local_68 = (LongReadsDatastore *)uVar17;
    }
    else {
      uVar10 = (byte)psVar14[0x10] + uVar10;
      if (0xfe < uVar10) {
        uVar10 = 0xff;
      }
      local_48 = (string *)CONCAT44(local_48._4_4_,uVar10);
    }
    psVar22 = local_50 + uVar12 * 0x208;
    *(undefined8 *)(psVar19 + -8) = 0x11;
    *(undefined8 *)(psVar19 + -8) = 0x20f425;
    std::istream::read((char *)psVar22,(long)psVar14);
    psVar14 = local_40;
    uVar21 = (ulong)local_48 & 0xffffffff;
    if (((byte)psVar22[*(long *)(*(long *)psVar22 + -0x18) + 0x20] & 2) != 0) {
      psVar18[uVar12 - uVar7] = (string)0x0;
      local_80 = (ulong)((int)local_80 + 1);
    }
  }
  hist[(long)&pKVar9[-1].count] = hist[(long)&pKVar9[-1].count] + 1;
  peVar4 = local_60;
  if (uVar10 < kmerlist._4_4_) {
    local_78 = local_78 + 1;
  }
  else {
    pKVar9 = local_60->kmers;
    psVar18 = *(string **)((long)&pKVar9->kdata + 8);
    if (psVar18 <= psVar14) {
      *(undefined8 *)(psVar19 + -8) = 0x20f48c;
      KmerList::resize((KmerList *)pKVar9,(size_t)(psVar18 + 10000000));
      pKVar9 = peVar4->kmers;
    }
    pKVar9 = *(KMerNodeFreq_s **)&pKVar9->kdata;
    *(ulong *)((long)&pKVar9[(long)psVar14].kdata + 8) = local_70;
    *(LongReadsDatastore **)&pKVar9[(long)psVar14].kdata = local_68;
    pKVar9[(long)psVar14].count = (uint8_t)uVar21;
    psVar14 = psVar14 + 1;
  }
  pKVar9 = local_60->kmers;
  local_40 = psVar14;
  *(undefined8 *)(psVar19 + -8) = 0x20f4c5;
  KmerList::resize((KmerList *)pKVar9,(size_t)psVar14);
  for (uVar21 = 0; local_38 != uVar21; uVar21 = uVar21 + 1) {
    *(undefined8 *)(psVar19 + -8) = 0x20f4e8;
    std::ifstream::close();
    psVar3 = local_88;
    *(undefined8 *)(psVar19 + -8) = 0x20f4fb;
    std::operator+(&local_a8,psVar3,"/kmer_count_batch_");
    *(undefined8 *)(psVar19 + -8) = 0x20f506;
    std::__cxx11::to_string(&local_f0,(int)uVar21);
    *(undefined8 *)(psVar19 + -8) = 0x20f51b;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                   &local_a8,&local_f0);
    __filename = local_2f0;
    *(undefined8 *)(psVar19 + -8) = 0x20f527;
    remove((char *)__filename);
    *(undefined8 *)(psVar19 + -8) = 0x20f52f;
    std::__cxx11::string::~string((string *)local_2f0);
    *(undefined8 *)(psVar19 + -8) = 0x20f537;
    std::__cxx11::string::~string((string *)&local_f0);
    *(undefined8 *)(psVar19 + -8) = 0x20f53f;
    std::__cxx11::string::~string((string *)&local_a8);
  }
  *(undefined8 *)(psVar19 + -8) = 1;
  uVar1 = *(undefined8 *)(psVar19 + -8);
  *(undefined8 *)(psVar19 + -8) = 0x20f555;
  poVar8 = sdglib::OutputLog(INFO,SUB81(uVar1,0));
  *(undefined8 *)(psVar19 + -8) = 0x20f561;
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  *(undefined8 *)(psVar19 + -8) = 0x20f570;
  poVar8 = std::operator<<(poVar8,"/");
  *(undefined8 *)(psVar19 + -8) = 0x20f580;
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  *(undefined8 *)(psVar19 + -8) = 0x20f58f;
  poVar8 = std::operator<<(poVar8," kmers with Freq >= ");
  *(undefined8 *)(psVar19 + -8) = 0x20f59a;
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  *(undefined8 *)(psVar19 + -8) = 0x20f5a2;
  std::endl<char,std::char_traits<char>>(poVar8);
  _Var2 = kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(undefined8 *)(psVar19 + -8) = 0x20f5b5;
  bVar6 = std::operator!=("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             _Var2._M_pi);
  uVar21 = local_38;
  _Var2 = kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  _Var15._M_pi = extraout_RDX;
  if (bVar6) {
    *(undefined8 *)(psVar19 + -8) = 0x20f5db;
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var2._M_pi,
                   "/small_K.freqs");
    *(undefined8 *)(psVar19 + -8) = 0x10;
    uVar1 = *(undefined8 *)(psVar19 + -8);
    *(undefined8 *)(psVar19 + -8) = 0x20f5f1;
    std::ofstream::ofstream(local_2f0,(string *)&local_a8,(_Ios_Openmode)uVar1);
    *(undefined8 *)(psVar19 + -8) = 0x20f5fd;
    std::__cxx11::string::~string((string *)&local_a8);
    *(undefined8 *)(psVar19 + -8) = 1;
    for (lVar11 = *(long *)(psVar19 + -8); lVar11 != 0x100; lVar11 = lVar11 + 1) {
      *(undefined8 *)(psVar19 + -8) = 0x20f623;
      poVar8 = (ostream *)std::ostream::operator<<(local_2f0,(int)lVar11);
      *(undefined8 *)(psVar19 + -8) = 0x20f62e;
      poVar8 = std::operator<<(poVar8,", ");
      *(undefined8 *)(psVar19 + -8) = 0x20f63e;
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      *(undefined8 *)(psVar19 + -8) = 0x20f646;
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    *(undefined8 *)(psVar19 + -8) = 0x20f657;
    std::ofstream::close();
    *(undefined8 *)(psVar19 + -8) = 0x20f663;
    std::ofstream::~ofstream(local_2f0);
    _Var15._M_pi = extraout_RDX_00;
  }
  psVar18 = local_50;
  if ((char)uVar21 != '\0') {
    lVar11 = uVar21 * 0x208;
    do {
      *(undefined8 *)(psVar19 + -8) = 0x20f682;
      std::ifstream::~ifstream(psVar18 + lVar11 + -0x208);
      lVar11 = lVar11 + -0x208;
      _Var15._M_pi = extraout_RDX_01;
    } while (lVar11 != 0);
  }
  sVar23.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var15._M_pi;
  sVar23.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60;
  return (shared_ptr<KmerList>)sVar23.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<KmerList>
BatchKmersCounter::kmerCountOMPDiskBased(uint8_t K, LongReadsDatastore const &reads,
                                         unsigned minCount, std::string tmpdir, std::string workdir,
                                         unsigned char disk_batches) {

    //If size larger than batch (or still not enough cpus used, or whatever), Lauch 2 tasks to sort the 2 halves, with minFreq=0

    sdglib::OutputLog() << "disk-based kmer counting with "<<(int) disk_batches<<" batches"<<std::endl;
    uint64_t total_kmers_in_batches=0;
    for (auto batch=0;batch < disk_batches;batch++) {
        uint64_t to = (batch+1) * reads.size()/disk_batches;
        uint64_t from= batch * reads.size()/disk_batches;
        auto kmer_list = kmerCountOMP(K, reads,from,to);
        std::ofstream batch_file(tmpdir+"/kmer_count_batch_"+std::to_string((int)batch),std::ios::out | std::ios::trunc | std::ios::binary);
        batch_file.write((const char *)kmer_list->kmers,sizeof(KMerNodeFreq_s)*kmer_list->size);
        batch_file.close();
        sdglib::OutputLog() << "batch "<<(int) batch<<" done and dumped with "<<kmer_list->size<< " kmers" <<std::endl;
        total_kmers_in_batches+=kmer_list->size;
    }

    //now a multi-merge sort between all batch files into the Dict
    sdglib::OutputLog() << "merging from disk"<<std::endl;
    //open all batch files
    std::ifstream dbf[disk_batches];
    bool dbf_active[disk_batches];
    KMerNodeFreq_s next_knf_from_dbf[disk_batches];
    uint finished_files=0;
    for (auto i=0;i<disk_batches;i++){
        dbf[i].open(tmpdir+"/kmer_count_batch_"+std::to_string((int)i),std::ios::in | std::ios::binary);
        dbf[i].read((char *)&next_knf_from_dbf[i],sizeof(KMerNodeFreq_s));
        dbf_active[i]=true;
    }
    //set all finished flags to false
    //TODO: stupid minimum search
    KMerNodeFreq_s current_kmer;
    //while finished_files<batches
    bool first=true;
    uint min=0;
    for (auto i=1;i<disk_batches;++i)
        if (dbf_active[i]){
            if (next_knf_from_dbf[i]<next_knf_from_dbf[min]) min=i;
        }
    current_kmer=next_knf_from_dbf[min];
    current_kmer.count=0;
    uint64_t used = 0,not_used=0;
    uint64_t hist[256];
    for (auto &h:hist) h=0;
    std::shared_ptr<KmerList> kmerlist=std::make_shared<KmerList>();
    //size_t last_kmer=0;
    size_t alloc_block=10000000;
    while (finished_files<disk_batches) {
        //find minimum of the non-finished files
        uint min=0;
        while (!dbf_active[min])++min;
        for (auto i=1;i<disk_batches;++i)
            if (dbf_active[i]){
                if (next_knf_from_dbf[i]<next_knf_from_dbf[min]) min=i;
            }
        //larger than current kmer?
        if (next_knf_from_dbf[min] > current_kmer) {
            ++hist[std::min(255,(int)current_kmer.count)];
            if (current_kmer.count>=minCount) {
                //(*dict)->insertEntryNoLocking(BRQ_Entry((BRQ_Kmer) current_kmer, current_kmer.kc));
                //kmerlist.push_back(current_kmer);
                if (used>=kmerlist->size) kmerlist->resize(kmerlist->size+alloc_block);
                kmerlist->kmers[used]=current_kmer;
                ++used;
            }
            else ++not_used;
            current_kmer=next_knf_from_dbf[min];
        } else {
            current_kmer.combine(next_knf_from_dbf[min]);
        }
        //advance min file
        dbf[min].read((char *)&next_knf_from_dbf[min],sizeof(KMerNodeFreq_s));
        if ( dbf[min].eof() ) {
            dbf_active[min]=false;
            ++finished_files;
        }
    }

    ++hist[(int)current_kmer.count];
    if (current_kmer.count>=minCount) {
        //kmerlist.push_back(current_kmer);
        if (used>=kmerlist->size) kmerlist->resize(kmerlist->size+alloc_block);
        kmerlist->kmers[used]=current_kmer;
        used++;
    }
    else not_used++;
    kmerlist->resize(used);
    for (auto i=0;i<disk_batches;i++) {
        dbf[i].close();
        std::remove((tmpdir + "/kmer_count_batch_" +std::to_string((int)i)).c_str());
    }
    sdglib::OutputLog()<< used << "/" << used+not_used << " kmers with Freq >= " << minCount << std::endl;
    if (""!=workdir) {
        std::ofstream kff(workdir + "/small_K.freqs");
        for (auto i = 1; i < 256; i++) kff << i << ", " << hist[i] << std::endl;
        kff.close();
    }
    return kmerlist;
}